

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O1

bool __thiscall
Assimp::Q3BSPFileImporter::importLightmap
          (Q3BSPFileImporter *this,Q3BSPModel *pModel,aiScene *pScene,aiMaterial *pMatHelper,
          int lightmapId)

{
  pointer *pppaVar1;
  pointer ppsVar2;
  sQ3BSPLightmap *__src;
  iterator __position;
  bool bVar3;
  aiTexture *paVar4;
  aiTexel *__dest;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  char *pcVar8;
  char *__s;
  long lVar9;
  uchar *puVar10;
  bool bVar11;
  aiTexture *pTexture;
  aiTexture *local_438;
  aiString local_42c;
  
  if (((lightmapId < 0 || pMatHelper == (aiMaterial *)0x0) ||
       (pScene == (aiScene *)0x0 || pModel == (Q3BSPModel *)0x0)) ||
     (ppsVar2 = (pModel->m_Lightmaps).
                super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
     (int)((ulong)((long)(pModel->m_Lightmaps).
                         super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar2) >> 3) <=
     lightmapId)) {
    bVar11 = false;
  }
  else {
    __src = ppsVar2[(uint)lightmapId];
    bVar11 = __src != (sQ3BSPLightmap *)0x0;
    if (bVar11) {
      paVar4 = (aiTexture *)operator_new(0x428);
      lVar9 = 0;
      paVar4->mWidth = 0;
      paVar4->mHeight = 0;
      paVar4->pcData = (aiTexel *)0x0;
      (paVar4->mFilename).length = 0;
      (paVar4->mFilename).data[0] = '\0';
      memset((paVar4->mFilename).data + 1,0x1b,0x3ff);
      paVar4->achFormatHint[0] = '\0';
      paVar4->achFormatHint[1] = '\0';
      paVar4->achFormatHint[2] = '\0';
      paVar4->achFormatHint[3] = '\0';
      paVar4->mWidth = 0x80;
      paVar4->mHeight = 0x80;
      local_438 = paVar4;
      __dest = (aiTexel *)operator_new__(0x10000);
      paVar4->pcData = __dest;
      memcpy(__dest,__src,0x80);
      puVar10 = __src->bLMapData + 2;
      do {
        local_438->pcData[lVar9].r = ((sQ3BSPLightmap *)(puVar10 + -2))->bLMapData[0];
        local_438->pcData[lVar9].g = puVar10[-1];
        local_438->pcData[lVar9].b = *puVar10;
        local_438->pcData[lVar9].a = 0xff;
        lVar9 = lVar9 + 1;
        puVar10 = puVar10 + 3;
      } while (lVar9 != 0x4000);
      __s = local_42c.data + 1;
      local_42c.length = 0;
      memset(__s,0x1b,0x3ff);
      local_42c.data[0] = '*';
      uVar5 = (ulong)((long)(this->mTextures).
                            super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->mTextures).
                           super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3;
      local_42c.length = 1;
      if ((int)uVar5 < 0) {
        __s = local_42c.data + 2;
        local_42c.data[1] = '-';
        uVar5 = (ulong)(uint)-(int)uVar5;
        local_42c.length = 2;
      }
      iVar7 = 1000000000;
      bVar11 = false;
      do {
        pcVar8 = __s;
        if (0x3fe < local_42c.length) break;
        uVar6 = (ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff;
        lVar9 = (long)uVar6 / (long)iVar7;
        uVar6 = (long)uVar6 % (long)iVar7 & 0xffffffff;
        if (((bVar11) || (iVar7 == 1)) || ((int)lVar9 != 0)) {
          pcVar8 = __s + 1;
          local_42c.length = local_42c.length + 1;
          *__s = (char)lVar9 + '0';
          bVar11 = true;
          if (iVar7 != 1) goto LAB_0061e1d7;
          bVar3 = false;
          iVar7 = 1;
          uVar5 = uVar6;
        }
        else {
          uVar6 = uVar5 & 0xffffffff;
LAB_0061e1d7:
          iVar7 = iVar7 / 10;
          bVar3 = true;
          uVar5 = uVar6;
        }
        __s = pcVar8;
      } while (bVar3);
      *pcVar8 = '\0';
      aiMaterial::AddProperty(pMatHelper,&local_42c,"$tex.file",10,1);
      __position._M_current =
           (this->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiTexture*,std::allocator<aiTexture*>>::_M_realloc_insert<aiTexture*const&>
                  ((vector<aiTexture*,std::allocator<aiTexture*>> *)&this->mTextures,__position,
                   &local_438);
      }
      else {
        *__position._M_current = local_438;
        pppaVar1 = &(this->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppaVar1 = *pppaVar1 + 1;
      }
      bVar11 = true;
    }
  }
  return bVar11;
}

Assistant:

bool Q3BSPFileImporter::importLightmap( const Q3BSP::Q3BSPModel *pModel, aiScene* pScene,
                                       aiMaterial *pMatHelper, int lightmapId )
{
    if (nullptr == pModel || nullptr == pScene || nullptr == pMatHelper ) {
        return false;
    }

    if ( lightmapId < 0 || lightmapId >= static_cast<int>( pModel->m_Lightmaps.size() ) ) {
        return false;
    }

    sQ3BSPLightmap *pLightMap = pModel->m_Lightmaps[ lightmapId ];
    if (nullptr == pLightMap ) {
        return false;
    }

    aiTexture *pTexture = new aiTexture;

    pTexture->mWidth = CE_BSP_LIGHTMAPWIDTH;
    pTexture->mHeight = CE_BSP_LIGHTMAPHEIGHT;
    pTexture->pcData = new aiTexel[CE_BSP_LIGHTMAPWIDTH * CE_BSP_LIGHTMAPHEIGHT];

    ::memcpy( pTexture->pcData, pLightMap->bLMapData, pTexture->mWidth );
    size_t p = 0;
    for ( size_t i = 0; i < CE_BSP_LIGHTMAPWIDTH * CE_BSP_LIGHTMAPHEIGHT; ++i ) {
        pTexture->pcData[ i ].r = pLightMap->bLMapData[ p++ ];
        pTexture->pcData[ i ].g = pLightMap->bLMapData[ p++ ];
        pTexture->pcData[ i ].b = pLightMap->bLMapData[ p++ ];
        pTexture->pcData[ i ].a = 0xFF;
    }

    aiString name;
    name.data[ 0 ] = '*';
    name.length = 1 + ASSIMP_itoa10( name.data + 1, static_cast<unsigned int>(MAXLEN-1), static_cast<int32_t>(mTextures.size()) );

    pMatHelper->AddProperty( &name,AI_MATKEY_TEXTURE_LIGHTMAP( 1 ) );
    mTextures.push_back( pTexture );

    return true;
}